

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes_dxil_builtins.cpp
# Opt level: O0

bool dxil_spv::analyze_alloca_cbv_forwarding_pre_resource_emit
               (Impl *impl,Type *scalar_type,AllocaCBVForwardingTracking *tracking)

{
  bool bVar1;
  pointer ppVar2;
  pointer ppVar3;
  _Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>,_false>
  _Stack_50;
  RawType raw_type;
  _Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>,_false>
  local_48;
  iterator annotate_itr;
  _Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_unsigned_int>,_false> local_38;
  iterator itr;
  AccessTracking *cbv_tracking;
  AllocaCBVForwardingTracking *tracking_local;
  Type *scalar_type_local;
  Impl *impl_local;
  
  if (tracking->cbv_handle != (Value *)0x0) {
    if (((tracking->has_load & 1U) == 0) || (tracking->stride == 0)) {
      tracking->cbv_handle = (Value *)0x0;
    }
    else if (tracking->highest_store_index < tracking->min_highest_store_index) {
      tracking->cbv_handle = (Value *)0x0;
    }
    else {
      itr.super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_unsigned_int>,_false>.
      _M_cur = (_Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_unsigned_int>,_false>)
               (__node_type *)0x0;
      local_38._M_cur =
           (__node_type *)
           std::
           unordered_map<const_LLVMBC::Value_*,_unsigned_int,_std::hash<const_LLVMBC::Value_*>,_std::equal_to<const_LLVMBC::Value_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_unsigned_int>_>_>
           ::find(&impl->llvm_value_to_cbv_resource_index_map,&tracking->cbv_handle);
      annotate_itr.
      super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>,_false>
      ._M_cur = (_Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>,_false>
                 )std::
                  unordered_map<const_LLVMBC::Value_*,_unsigned_int,_std::hash<const_LLVMBC::Value_*>,_std::equal_to<const_LLVMBC::Value_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_unsigned_int>_>_>
                  ::end(&impl->llvm_value_to_cbv_resource_index_map);
      bVar1 = std::__detail::operator!=
                        (&local_38,
                         (_Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_unsigned_int>,_false>
                          *)&annotate_itr);
      if (bVar1) {
        ppVar2 = std::__detail::
                 _Node_iterator<std::pair<const_LLVMBC::Value_*const,_unsigned_int>,_false,_false>::
                 operator->((_Node_iterator<std::pair<const_LLVMBC::Value_*const,_unsigned_int>,_false,_false>
                             *)&local_38);
        itr.super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_unsigned_int>,_false>.
        _M_cur = (_Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_unsigned_int>,_false>)
                 std::
                 unordered_map<unsigned_int,_dxil_spv::Converter::Impl::AccessTracking,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::AccessTracking>_>_>
                 ::operator[](&impl->cbv_access_tracking,&ppVar2->second);
      }
      if (itr.super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_unsigned_int>,_false>.
          _M_cur == (__node_type *)0x0) {
        local_48._M_cur =
             (__node_type *)
             std::
             unordered_map<const_LLVMBC::Value_*,_dxil_spv::Converter::Impl::AnnotateHandleReference,_std::hash<const_LLVMBC::Value_*>,_std::equal_to<const_LLVMBC::Value_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>_>_>
             ::find(&impl->llvm_annotate_handle_uses,&tracking->cbv_handle);
        _Stack_50._M_cur =
             (__node_type *)
             std::
             unordered_map<const_LLVMBC::Value_*,_dxil_spv::Converter::Impl::AnnotateHandleReference,_std::hash<const_LLVMBC::Value_*>,_std::equal_to<const_LLVMBC::Value_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>_>_>
             ::end(&impl->llvm_annotate_handle_uses);
        bVar1 = std::__detail::operator!=(&local_48,&stack0xffffffffffffffb0);
        if (bVar1) {
          ppVar3 = std::__detail::
                   _Node_iterator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>,_false,_false>
                   ::operator->((_Node_iterator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>,_false,_false>
                                 *)&local_48);
          itr.super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_unsigned_int>,_false>.
          _M_cur = (_Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_unsigned_int>,_false>)
                   &(ppVar3->second).tracking;
        }
      }
      if (itr.super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_unsigned_int>,_false>.
          _M_cur != (__node_type *)0x0) {
        bVar1 = LLVMBC::Type::isFloatingPointTy(scalar_type);
        *(undefined1 *)
         ((long)itr.
                super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_unsigned_int>,_false>
                ._M_cur + (long)(int)(uint)bVar1 * 0x10 + 0xd) = 1;
      }
    }
  }
  return true;
}

Assistant:

bool analyze_alloca_cbv_forwarding_pre_resource_emit(Converter::Impl &impl, const llvm::Type *scalar_type,
                                                     AllocaCBVForwardingTracking &tracking)
{
	if (!tracking.cbv_handle)
		return true;

	if (!tracking.has_load || !tracking.stride)
	{
		tracking.cbv_handle = nullptr;
		return true;
	}

	// Robustness purposes, if we cannot prove that all input data was read,
	// we may falsely cause an OOB read on BDA to happen when we redirect a load to it.
	if (tracking.highest_store_index < tracking.min_highest_store_index)
	{
		tracking.cbv_handle = nullptr;
		return true;
	}

	Converter::Impl::AccessTracking *cbv_tracking = nullptr;
	auto itr = impl.llvm_value_to_cbv_resource_index_map.find(tracking.cbv_handle);
	if (itr != impl.llvm_value_to_cbv_resource_index_map.end())
		cbv_tracking = &impl.cbv_access_tracking[itr->second];

	if (!cbv_tracking)
	{
		auto annotate_itr = impl.llvm_annotate_handle_uses.find(tracking.cbv_handle);
		if (annotate_itr != impl.llvm_annotate_handle_uses.end())
			cbv_tracking = &annotate_itr->second.tracking;
	}

	if (cbv_tracking)
	{
		auto raw_type = scalar_type->isFloatingPointTy() ? RawType::Float : RawType::Integer;
		cbv_tracking->raw_access_buffer_declarations[int(raw_type)][int(RawWidth::B32)][int(RawVecSize::V1)] = true;
	}

	return true;
}